

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

bool cmStrToULong(char *str,unsigned_long *value)

{
  bool bVar1;
  int *piVar2;
  ulong uVar3;
  bool local_29;
  unsigned_long *local_28;
  char *endp;
  unsigned_long *value_local;
  char *str_local;
  
  endp = (char *)value;
  value_local = (unsigned_long *)str;
  piVar2 = __errno_location();
  *piVar2 = 0;
  while( true ) {
    bVar1 = cmIsSpace((char)*value_local);
    if (!bVar1) break;
    value_local = (unsigned_long *)((long)value_local + 1);
  }
  if ((char)*value_local == '-') {
    str_local._7_1_ = false;
  }
  else {
    uVar3 = strtoul((char *)value_local,(char **)&local_28,10);
    *(ulong *)endp = uVar3;
    local_29 = false;
    if (((char)*local_28 == '\0') && (local_29 = false, local_28 != value_local)) {
      piVar2 = __errno_location();
      local_29 = *piVar2 == 0;
    }
    str_local._7_1_ = local_29;
  }
  return str_local._7_1_;
}

Assistant:

bool cmStrToULong(const char* str, unsigned long* value)
{
  errno = 0;
  char* endp;
  while (cmIsSpace(*str)) {
    ++str;
  }
  if (*str == '-') {
    return false;
  }
  *value = strtoul(str, &endp, 10);
  return (*endp == '\0') && (endp != str) && (errno == 0);
}